

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psset.c
# Opt level: O0

pszind_t psset_hpdata_heap_index(hpdata_t *ps)

{
  uint uVar1;
  size_t sVar2;
  hpdata_t *in_RDI;
  pszind_t pind;
  size_t longest_free_range;
  pszind_t ind;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  undefined1 local_44;
  undefined4 local_40;
  undefined4 local_4;
  
  hpdata_longest_free_range_get(in_RDI);
  sVar2 = duckdb_je_sz_psz_quantize_floor((size_t)in_RDI);
  if (sVar2 < 0x7000000000000001) {
    uVar1 = lg_ceil(0x25654a0);
    if (uVar1 < 0xe) {
      local_40 = 0;
    }
    else {
      local_40 = uVar1 - 0xe;
    }
    if (local_40 == 0) {
      local_44 = 0xc;
    }
    else {
      local_44 = (char)local_40 + 0xb;
    }
    local_4 = local_40 * 4 + ((uint)(sVar2 - 1 >> (local_44 & 0x3f)) & 3);
  }
  else {
    local_4 = 199;
  }
  return local_4;
}

Assistant:

static pszind_t
psset_hpdata_heap_index(const hpdata_t *ps) {
	assert(!hpdata_full(ps));
	assert(!hpdata_empty(ps));
	size_t longest_free_range = hpdata_longest_free_range_get(ps);
	pszind_t pind = sz_psz2ind(sz_psz_quantize_floor(
	    longest_free_range << LG_PAGE));
	assert(pind < PSSET_NPSIZES);
	return pind;
}